

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bitstream.cpp
# Opt level: O0

string * slang::ast::formatWidth<slang::ast::StreamingConcatenationExpression>
                   (string *__return_storage_ptr__,StreamingConcatenationExpression *bitstream,
                   BitstreamSizeMode mode)

{
  type *args;
  type *args_1;
  size_t sVar1;
  basic_string_view<char> local_318;
  basic_string_view<char> local_308;
  basic_string_view<char> local_2f8;
  type *fixedSize;
  type *multiplier;
  pair<unsigned_long,_unsigned_long> local_2c8;
  undefined1 local_2b8 [8];
  FormatBuffer buffer;
  BitstreamSizeMode mode_local;
  StreamingConcatenationExpression *bitstream_local;
  
  buffer._540_4_ = mode;
  FormatBuffer::FormatBuffer((FormatBuffer *)local_2b8);
  local_2c8 = dynamicBitstreamSize(bitstream,buffer._540_4_);
  args = std::get<0ul,unsigned_long,unsigned_long>(&local_2c8);
  args_1 = std::get<1ul,unsigned_long,unsigned_long>(&local_2c8);
  if (*args == 0) {
    sVar1 = std::char_traits<char>::length("{}");
    local_2f8.size_ = sVar1;
    FormatBuffer::format<unsigned_long&>
              ((FormatBuffer *)local_2b8,(format_string<unsigned_long_&>)local_2f8,args_1);
  }
  else if (*args_1 == 0) {
    sVar1 = std::char_traits<char>::length("{}*n");
    local_308.size_ = sVar1;
    FormatBuffer::format<unsigned_long&>
              ((FormatBuffer *)local_2b8,(format_string<unsigned_long_&>)local_308,args);
  }
  else {
    sVar1 = std::char_traits<char>::length("{}*n+{}");
    local_318.size_ = sVar1;
    FormatBuffer::format<unsigned_long&,unsigned_long&>
              ((FormatBuffer *)local_2b8,(format_string<unsigned_long_&,_unsigned_long_&>)local_318,
               args,args_1);
  }
  FormatBuffer::str_abi_cxx11_(__return_storage_ptr__,(FormatBuffer *)local_2b8);
  FormatBuffer::~FormatBuffer((FormatBuffer *)local_2b8);
  return __return_storage_ptr__;
}

Assistant:

static std::string formatWidth(const T& bitstream, BitstreamSizeMode mode) {
    FormatBuffer buffer;
    auto [multiplier, fixedSize] = dynamicBitstreamSize(bitstream, mode);
    if (!multiplier)
        buffer.format("{}", fixedSize);
    else if (!fixedSize)
        buffer.format("{}*n", multiplier);
    else
        buffer.format("{}*n+{}", multiplier, fixedSize);
    return buffer.str();
}